

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formats.h
# Opt level: O0

bool ktx::isFormatAstcLDR(VkFormat format)

{
  VkFormat format_local;
  bool local_1;
  
  if (((((format == VK_FORMAT_ASTC_4x4_UNORM_BLOCK) || (format == VK_FORMAT_ASTC_4x4_SRGB_BLOCK)) ||
       (format == VK_FORMAT_ASTC_5x4_UNORM_BLOCK)) ||
      (((((format == VK_FORMAT_ASTC_5x4_SRGB_BLOCK || (format == VK_FORMAT_ASTC_5x5_UNORM_BLOCK)) ||
         ((format == VK_FORMAT_ASTC_5x5_SRGB_BLOCK ||
          ((format == VK_FORMAT_ASTC_6x5_UNORM_BLOCK || (format == VK_FORMAT_ASTC_6x5_SRGB_BLOCK))))
         )) || (format == VK_FORMAT_ASTC_6x6_UNORM_BLOCK)) ||
       (((((format == VK_FORMAT_ASTC_6x6_SRGB_BLOCK || (format == VK_FORMAT_ASTC_8x5_UNORM_BLOCK))
          || (format == VK_FORMAT_ASTC_8x5_SRGB_BLOCK)) ||
         ((format == VK_FORMAT_ASTC_8x6_UNORM_BLOCK || (format == VK_FORMAT_ASTC_8x6_SRGB_BLOCK))))
        || ((format == VK_FORMAT_ASTC_8x8_UNORM_BLOCK ||
            ((format == VK_FORMAT_ASTC_8x8_SRGB_BLOCK || (format == VK_FORMAT_ASTC_10x5_UNORM_BLOCK)
             ))))))))) ||
     ((((format == VK_FORMAT_ASTC_10x5_SRGB_BLOCK ||
        (((((format == VK_FORMAT_ASTC_10x6_UNORM_BLOCK || (format == VK_FORMAT_ASTC_10x6_SRGB_BLOCK)
            ) || (format == VK_FORMAT_ASTC_10x8_UNORM_BLOCK)) ||
          ((format == VK_FORMAT_ASTC_10x8_SRGB_BLOCK || (format == VK_FORMAT_ASTC_10x10_UNORM_BLOCK)
           ))) || (format == VK_FORMAT_ASTC_10x10_SRGB_BLOCK)))) ||
       (((((format == VK_FORMAT_ASTC_12x10_UNORM_BLOCK ||
           (format == VK_FORMAT_ASTC_12x10_SRGB_BLOCK)) ||
          ((format == VK_FORMAT_ASTC_12x12_UNORM_BLOCK ||
           (((format == VK_FORMAT_ASTC_12x12_SRGB_BLOCK ||
             (format == VK_FORMAT_ASTC_3x3x3_UNORM_BLOCK_EXT)) ||
            (format == VK_FORMAT_ASTC_3x3x3_SRGB_BLOCK_EXT)))))) ||
         (((format == VK_FORMAT_ASTC_4x3x3_UNORM_BLOCK_EXT ||
           (format == VK_FORMAT_ASTC_4x3x3_SRGB_BLOCK_EXT)) ||
          (format == VK_FORMAT_ASTC_4x4x3_UNORM_BLOCK_EXT)))) ||
        (((format == VK_FORMAT_ASTC_4x4x3_SRGB_BLOCK_EXT ||
          (format == VK_FORMAT_ASTC_4x4x4_UNORM_BLOCK_EXT)) ||
         ((format == VK_FORMAT_ASTC_4x4x4_SRGB_BLOCK_EXT ||
          (((format == VK_FORMAT_ASTC_5x4x4_UNORM_BLOCK_EXT ||
            (format == VK_FORMAT_ASTC_5x4x4_SRGB_BLOCK_EXT)) ||
           (format == VK_FORMAT_ASTC_5x5x4_UNORM_BLOCK_EXT)))))))))) ||
      (((format == VK_FORMAT_ASTC_5x5x4_SRGB_BLOCK_EXT ||
        (format == VK_FORMAT_ASTC_5x5x5_UNORM_BLOCK_EXT)) ||
       ((format == VK_FORMAT_ASTC_5x5x5_SRGB_BLOCK_EXT ||
        (((format == VK_FORMAT_ASTC_6x5x5_UNORM_BLOCK_EXT ||
          (format == VK_FORMAT_ASTC_6x5x5_SRGB_BLOCK_EXT)) ||
         ((format == VK_FORMAT_ASTC_6x6x5_UNORM_BLOCK_EXT ||
          (((format == VK_FORMAT_ASTC_6x6x5_SRGB_BLOCK_EXT ||
            (format == VK_FORMAT_ASTC_6x6x6_UNORM_BLOCK_EXT)) ||
           (format == VK_FORMAT_ASTC_6x6x6_SRGB_BLOCK_EXT)))))))))))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

[[nodiscard]] constexpr inline bool isFormatAstcLDR(VkFormat format) noexcept {
    switch (format) {
    case VK_FORMAT_ASTC_4x4_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x6_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x6_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x8_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x8_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x6_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x6_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x8_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x8_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x10_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x10_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x10_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x10_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x12_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x12_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_3x3x3_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_3x3x3_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x3x3_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x3x3_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4x3_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4x3_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4x4_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4x4_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4x4_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4x4_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5x4_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5x4_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5x5_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5x5_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5x5_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5x5_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6x5_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6x5_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6x6_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6x6_SRGB_BLOCK_EXT:
        return true;
    default:
        return false;
    }
}